

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase266::run(TestCase266 *this)

{
  undefined8 *puVar1;
  unsigned_long *puVar2;
  unsigned_long *puVar3;
  Arena arena;
  unsigned_long *local_58;
  unsigned_long *local_50;
  Arena local_48;
  
  Arena::Arena(&local_48,0x28);
  puVar1 = (undefined8 *)Arena::allocateBytes(&local_48,8,8,false);
  puVar2 = (unsigned_long *)Arena::allocateBytes(&local_48,8,8,false);
  puVar3 = (unsigned_long *)Arena::allocateBytes(&local_48,8,8,false);
  if (puVar1 + 1 != puVar2 && _::Debug::minSeverity < 3) {
    local_58 = puVar2;
    local_50 = puVar1 + 1;
    _::Debug::log<char_const(&)[36],unsigned_long*,unsigned_long*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
               ,0x112,ERROR,"\"failed: expected \" \"(&i1 + 1) == (&i2)\", &i1 + 1, &i2",
               (char (*) [36])"failed: expected (&i1 + 1) == (&i2)",&local_50,&local_58);
  }
  if ((puVar2 + 1 == puVar3) && (_::Debug::minSeverity < 3)) {
    local_58 = puVar3;
    local_50 = puVar2 + 1;
    _::Debug::log<char_const(&)[36],unsigned_long*,unsigned_long*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
               ,0x113,ERROR,"\"failed: expected \" \"(&i2 + 1) != (&i3)\", &i2 + 1, &i3",
               (char (*) [36])"failed: expected (&i2 + 1) != (&i3)",&local_50,&local_58);
  }
  *puVar1 = 0x4d2;
  *puVar2 = 0x162e;
  *puVar3 = 0x2334;
  Arena::~Arena(&local_48);
  return;
}

Assistant:

TEST(Arena, MultiSegment) {
  // Sorry, this test makes assumptions about the size of ChunkHeader.
  Arena arena(sizeof(void*) == 4 ? 32 : 40);

  uint64_t& i1 = arena.allocate<uint64_t>();
  uint64_t& i2 = arena.allocate<uint64_t>();
  uint64_t& i3 = arena.allocate<uint64_t>();

  EXPECT_EQ(&i1 + 1, &i2);
  EXPECT_NE(&i2 + 1, &i3);

  i1 = 1234;
  i2 = 5678;
  i3 = 9012;
}